

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxList.cpp
# Opt level: O0

BoxList * __thiscall amrex::BoxList::accrete(BoxList *this,IntVect *sz)

{
  bool bVar1;
  IntVect *in_RSI;
  BoxList *in_RDI;
  Box *bx;
  iterator __end1;
  iterator __begin1;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *__range1;
  reference in_stack_ffffffffffffffd0;
  __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
  local_20 [2];
  IntVect *local_10;
  
  local_10 = in_RSI;
  local_20[0]._M_current =
       (Box *)std::vector<amrex::Box,_std::allocator<amrex::Box>_>::begin
                        ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_RDI);
  std::vector<amrex::Box,_std::allocator<amrex::Box>_>::end
            ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    in_stack_ffffffffffffffd0 =
         __gnu_cxx::
         __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>::
         operator*(local_20);
    Box::grow(in_stack_ffffffffffffffd0,local_10);
    __gnu_cxx::
    __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>::
    operator++(local_20);
  }
  return in_RDI;
}

Assistant:

BoxList&
BoxList::accrete (const IntVect& sz)
{
    for (auto& bx : m_lbox)
    {
        bx.grow(sz);
    }
    return *this;
}